

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O2

bool EDCircles::CircleFit(double *x,double *y,int N,double *pxc,double *pyc,double *pr,double *pe)

{
  undefined1 auVar1 [16];
  int i;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  
  *pe = 1e+20;
  if (2 < N) {
    uVar3 = (ulong)(uint)N;
    auVar13 = ZEXT816(0);
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      dVar4 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + x[uVar2];
      auVar13._8_8_ = dVar4 + y[uVar2];
    }
    dVar14 = (double)N;
    auVar1._8_8_ = dVar14;
    auVar1._0_8_ = dVar14;
    auVar13 = divpd(auVar13,auVar1);
    dVar7 = 0.0;
    dVar8 = 0.0;
    dVar4 = 0.0;
    dVar6 = 0.0;
    dVar5 = 0.0;
    dVar9 = 0.0;
    dVar10 = 0.0;
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      dVar11 = x[uVar2] - auVar13._0_8_;
      dVar12 = y[uVar2] - auVar13._8_8_;
      dVar5 = dVar5 + dVar11 * dVar11;
      dVar6 = dVar6 + dVar11 * dVar12;
      dVar4 = dVar4 + dVar12 * dVar12;
      dVar9 = dVar9 + dVar11 * dVar11 * dVar11;
      dVar10 = dVar10 + dVar11 * dVar12 * dVar12;
      dVar7 = dVar7 + dVar11 * dVar12 * dVar11;
      dVar8 = dVar8 + dVar12 * dVar12 * dVar12;
    }
    dVar11 = dVar5 * dVar4 - dVar6 * dVar6;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      dVar9 = (dVar10 + dVar9) * 0.5;
      dVar8 = (dVar8 + dVar7) * 0.5;
      dVar7 = (dVar4 * dVar9 + dVar8 * -dVar6) / dVar11;
      dVar11 = (dVar9 * -dVar6 + dVar5 * dVar8) / dVar11;
      dVar4 = (dVar4 + dVar5) / dVar14 + dVar7 * dVar7 + dVar11 * dVar11;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      *pxc = dVar7 + auVar13._0_8_;
      dVar11 = auVar13._8_8_ + dVar11;
      *pyc = dVar11;
      dVar5 = 0.0;
      for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        dVar6 = y[uVar2] - dVar11;
        dVar6 = SQRT((x[uVar2] - *pxc) * (x[uVar2] - *pxc) + dVar6 * dVar6) - dVar4;
        dVar5 = dVar5 + dVar6 * dVar6;
      }
      *pr = dVar4;
      dVar5 = dVar5 / dVar14;
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      *pe = dVar5;
      return true;
    }
  }
  return false;
}

Assistant:

bool EDCircles::CircleFit(double * x, double * y, int N, double * pxc, double * pyc, double * pr, double * pe)
{
	*pe = 1e20;
	if (N < 3) return false;

	double xAvg = 0;
	double yAvg = 0;

	for (int i = 0; i<N; i++) {
		xAvg += x[i];
		yAvg += y[i];
	} //end-for

	xAvg /= N;
	yAvg /= N;

	double Suu = 0;
	double Suv = 0;
	double Svv = 0;
	double Suuu = 0;
	double Suvv = 0;
	double Svvv = 0;
	double Svuu = 0;
	for (int i = 0; i<N; i++) {
		double u = x[i] - xAvg;
		double v = y[i] - yAvg;

		Suu += u*u;
		Suv += u*v;
		Svv += v*v;
		Suuu += u*u*u;
		Suvv += u*v*v;
		Svvv += v*v*v;
		Svuu += v*u*u;
	} //end-for

	  // Now, we solve for the following linear system of equations
	  // Av = b, where v = (uc, vc) is the center of the circle
	  //
	  // |N    Suv| |uc| = |b1|
	  // |Suv  Svv| |vc| = |b2|
	  //
	  // where b1 = 0.5*(Suuu+Suvv) and b2 = 0.5*(Svvv+Svuu)
	  //
	double detA = Suu*Svv - Suv*Suv;
	if (detA == 0) return false;

	double b1 = 0.5*(Suuu + Suvv);
	double b2 = 0.5*(Svvv + Svuu);

	double uc = (Svv*b1 - Suv*b2) / detA;
	double vc = (Suu*b2 - Suv*b1) / detA;

	double R = sqrt(uc*uc + vc*vc + (Suu + Svv) / N);

	*pxc = uc + xAvg;
	*pyc = vc + yAvg;

	// Compute mean square error
	double error = 0;
	for (int i = 0; i<N; i++) {
		double dx = x[i] - *pxc;
		double dy = y[i] - *pyc;
		double d = sqrt(dx*dx + dy*dy) - R;
		error += d*d;
	} //end-for

	*pr = R;
	*pe = sqrt(error / N);

	return true;
}